

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

WaveAudioDescriptor * __thiscall
ASDCP::MXF::WaveAudioDescriptor::InitFromTLVSet(WaveAudioDescriptor *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    GenericSoundEssenceDescriptor::InitFromTLVSet(&this->super_GenericSoundEssenceDescriptor,TLVSet)
    ;
    if (-1 < *(int *)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                      super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_WaveAudioDescriptor_BlockAlign);
      TLVReader::ReadUi16(&local_80,in_RDX,(ui16_t *)pMVar2);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                        super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                        _vptr_KLVPacket) {
        pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_WaveAudioDescriptor_SequenceOffset);
        TLVReader::ReadUi8(&local_80,in_RDX,pMVar2->ul);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        iVar1 = *(int *)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                         super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                         _vptr_KLVPacket;
        *(bool *)((long)&TLVSet[6].super_MemIOReader.m_capacity + 3) = iVar1 == Kumu::RESULT_OK;
        if (-1 < iVar1) {
          pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_WaveAudioDescriptor_AvgBps);
          TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar2);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                            super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                            _vptr_KLVPacket) {
            pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_WaveAudioDescriptor_ChannelAssignment);
            TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            *(bool *)&TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 *(int *)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                          super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                          _vptr_KLVPacket == Kumu::RESULT_OK;
          }
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x668,
                "virtual ASDCP::Result_t ASDCP::MXF::WaveAudioDescriptor::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
WaveAudioDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = GenericSoundEssenceDescriptor::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi16(OBJ_READ_ARGS(WaveAudioDescriptor, BlockAlign));
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(WaveAudioDescriptor, SequenceOffset));
    SequenceOffset.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(WaveAudioDescriptor, AvgBps));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(WaveAudioDescriptor, ChannelAssignment));
    ChannelAssignment.set_has_value( result == RESULT_OK );
  }
  return result;
}